

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::FieldDescriptorProto::_InternalParse
          (FieldDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint64 uVar2;
  ParseContext *pPVar3;
  EpsCopyInputStream *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint64 val_1;
  uint64 val;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  EpsCopyInputStream *in_stack_ffffffffffffff88;
  ParseContext *in_stack_ffffffffffffff90;
  ParseContext *in_stack_ffffffffffffff98;
  ParseContext *in_stack_ffffffffffffffb0;
  ParseContext *in_stack_ffffffffffffffb8;
  uint local_3c;
  HasBits local_2c;
  EpsCopyInputStream *local_28;
  char *local_20;
  HasBits *local_10;
  HasBits *local_8;
  
  local_10 = &local_2c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_8 = local_10;
  memset(local_10,0,4);
  GetArenaNoVirtual((FieldDescriptorProto *)in_stack_ffffffffffffff90);
LAB_005111a1:
  do {
    bVar1 = internal::ParseContext::Done
                      (in_stack_ffffffffffffff90,&in_stack_ffffffffffffff88->limit_end_);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00511694;
    local_20 = internal::ReadTag((char *)in_stack_ffffffffffffffb8,
                                 (uint32 *)in_stack_ffffffffffffffb0,(uint32)((ulong)in_RDI >> 0x20)
                                );
    if (local_20 == (char *)0x0) goto LAB_005116b1;
    pPVar3 = (ParseContext *)(ulong)((local_3c >> 3) - 1);
    switch(pPVar3) {
    case (ParseContext *)0x0:
      if ((local_3c & 0xff) != 10) break;
      _internal_mutable_name_abi_cxx11_((FieldDescriptorProto *)pPVar3);
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)in_stack_ffffffffffffffb0,(char *)in_RDI,pPVar3,
                            (char *)in_stack_ffffffffffffff98);
      goto joined_r0x005114a9;
    case (ParseContext *)0x1:
      if ((local_3c & 0xff) == 0x12) {
        _internal_mutable_extendee_abi_cxx11_((FieldDescriptorProto *)pPVar3);
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffb0,(char *)in_RDI,pPVar3,
                              (char *)in_stack_ffffffffffffff98);
        goto joined_r0x005114a9;
      }
      break;
    case (ParseContext *)0x2:
      if ((local_3c & 0xff) == 0x18) {
        _Internal::set_has_number(&local_2c);
        uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffff90);
        *(int *)&(in_RDI->super_EpsCopyInputStream).aliasing_ = (int)uVar2;
        goto joined_r0x005114a9;
      }
      break;
    case (ParseContext *)0x3:
      if ((local_3c & 0xff) == 0x20) {
        in_stack_ffffffffffffffb8 =
             (ParseContext *)internal::ReadVarint((char **)in_stack_ffffffffffffff90);
        if (local_20 == (char *)0x0) goto LAB_005116b1;
        bVar1 = FieldDescriptorProto_Label_IsValid((int)in_stack_ffffffffffffffb8);
        if (bVar1) {
          _internal_set_label((FieldDescriptorProto *)in_RDI,
                              (FieldDescriptorProto_Label)in_stack_ffffffffffffffb8);
        }
        else {
          pPVar3 = in_stack_ffffffffffffffb8;
          mutable_unknown_fields((FieldDescriptorProto *)in_stack_ffffffffffffff90);
          internal::WriteVarint
                    ((uint32)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     (uint64)in_stack_ffffffffffffff88,(UnknownFieldSet *)0x5113ba);
          in_stack_ffffffffffffff98 = in_stack_ffffffffffffffb8;
          in_stack_ffffffffffffffb8 = pPVar3;
        }
        goto LAB_005111a1;
      }
      break;
    case (ParseContext *)0x4:
      if ((local_3c & 0xff) == 0x28) {
        in_stack_ffffffffffffffb0 =
             (ParseContext *)internal::ReadVarint((char **)in_stack_ffffffffffffff90);
        if (local_20 == (char *)0x0) goto LAB_005116b1;
        bVar1 = FieldDescriptorProto_Type_IsValid((int)in_stack_ffffffffffffffb0);
        if (bVar1) {
          _internal_set_type((FieldDescriptorProto *)in_RDI,
                             (FieldDescriptorProto_Type)in_stack_ffffffffffffffb0);
        }
        else {
          pPVar3 = in_stack_ffffffffffffffb0;
          mutable_unknown_fields((FieldDescriptorProto *)in_stack_ffffffffffffffb0);
          internal::WriteVarint
                    ((uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                     (uint64)in_stack_ffffffffffffff88,(UnknownFieldSet *)0x511451);
          in_stack_ffffffffffffff90 = in_stack_ffffffffffffffb0;
          in_stack_ffffffffffffffb0 = pPVar3;
        }
        goto LAB_005111a1;
      }
      break;
    case (ParseContext *)0x5:
      if ((local_3c & 0xff) == 0x32) {
        _internal_mutable_type_name_abi_cxx11_((FieldDescriptorProto *)pPVar3);
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffb0,(char *)in_RDI,pPVar3,
                              (char *)in_stack_ffffffffffffff98);
        goto joined_r0x005114a9;
      }
      break;
    case (ParseContext *)0x6:
      if ((local_3c & 0xff) == 0x3a) {
        _internal_mutable_default_value_abi_cxx11_((FieldDescriptorProto *)pPVar3);
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffb0,(char *)in_RDI,pPVar3,
                              (char *)in_stack_ffffffffffffff98);
        goto joined_r0x005114a9;
      }
      break;
    case (ParseContext *)0x7:
      if ((local_3c & 0xff) == 0x42) {
        in_stack_ffffffffffffff88 = local_28;
        _internal_mutable_options((FieldDescriptorProto *)in_stack_ffffffffffffff90);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::FieldOptions>
                             (in_RDI,(FieldOptions *)pPVar3,(char *)in_stack_ffffffffffffff98);
        goto joined_r0x005114a9;
      }
      break;
    case (ParseContext *)0x8:
      if ((local_3c & 0xff) == 0x48) {
        _Internal::set_has_oneof_index(&local_2c);
        uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffff90);
        *(int *)((long)&(in_RDI->super_EpsCopyInputStream).aliasing_ + 4) = (int)uVar2;
        goto joined_r0x005114a9;
      }
      break;
    case (ParseContext *)0x9:
      if ((local_3c & 0xff) == 0x52) {
        _internal_mutable_json_name_abi_cxx11_((FieldDescriptorProto *)pPVar3);
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffb0,(char *)in_RDI,pPVar3,
                              (char *)in_stack_ffffffffffffff98);
        goto joined_r0x005114a9;
      }
    }
    if (((local_3c & 7) == 4) || (local_3c == 0)) {
      internal::EpsCopyInputStream::SetLastTag(local_28,local_3c);
      goto LAB_00511694;
    }
    local_20 = internal::UnknownFieldParse
                         ((uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          (InternalMetadataWithArena *)in_RDI,(char *)pPVar3,
                          in_stack_ffffffffffffff98);
joined_r0x005114a9:
    if (local_20 == (char *)0x0) {
LAB_005116b1:
      local_20 = (char *)0x0;
LAB_00511694:
      internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,&local_2c);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* FieldDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string extendee = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_extendee(), ptr, ctx, "google.protobuf.FieldDescriptorProto.extendee");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 number = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_number(&has_bits);
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(val))) {
            _internal_set_label(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(4, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type_IsValid(val))) {
            _internal_set_type(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional string type_name = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_type_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.type_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string default_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_default_value(), ptr, ctx, "google.protobuf.FieldDescriptorProto.default_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 oneof_index = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          _Internal::set_has_oneof_index(&has_bits);
          oneof_index_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string json_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_json_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.json_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}